

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                    (string *str,uint8_t *target)

{
  LogMessage *other;
  uint8_t *__dest;
  size_t __n;
  ulong uVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = str->_M_string_length;
  if (uVar1 >> 0x20 != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x3b5);
    other = internal::LogMessage::operator<<
                      (&local_50,
                       "CHECK failed: (str.size()) <= (std::numeric_limits<uint32_t>::max()): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    uVar1 = str->_M_string_length;
  }
  __dest = WriteVarint32ToArray((uint32_t)uVar1,target);
  __n = (size_t)(int)str->_M_string_length;
  memcpy(__dest,(str->_M_dataplus)._M_p,__n);
  return __dest + __n;
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8_t* target) {
  GOOGLE_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}